

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O3

void __thiscall Sound_Queue::fill_buffer(Sound_Queue *this,Uint8 *out,int count)

{
  uint uVar1;
  
  uVar1 = SDL_SemValue(this->free_sem);
  if (1 < uVar1) {
    memset(out,0,(long)count);
    return;
  }
  if ((ulong)(uint)this->read_buf < 3) {
    memcpy(out,this->bufs + (ulong)(uint)this->read_buf * 0x800,(long)count);
    this->read_buf = this->read_buf + ((this->read_buf + 1) / 3) * -3 + 1;
    SDL_SemPost(this->free_sem);
    return;
  }
  __assert_fail("(unsigned) index < buf_count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/Sound_Queue.cpp"
                ,0x5e,"Sound_Queue::sample_t *Sound_Queue::buf(int)");
}

Assistant:

void Sound_Queue::fill_buffer( Uint8* out, int count )
{
	if ( SDL_SemValue( free_sem ) < buf_count - 1 )
	{
		memcpy( out, buf( read_buf ), count );
		read_buf = (read_buf + 1) % buf_count;
		SDL_SemPost( free_sem );
	}
	else
	{
		memset( out, 0, count );
	}
}